

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O3

char * CVmRun::get_exc_message(CVmException *exc,size_t *msg_len)

{
  char *pcVar1;
  
  if ((exc->error_code_ == 0x8fe) && (0 < exc->param_count_)) {
    pcVar1 = get_exc_message(exc->params_[0].val_.intval_,msg_len);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

const char *CVmRun::get_exc_message(VMG_ const CVmException *exc,
                                    size_t *msg_len)
{
    vm_obj_id_t exc_obj;

    /* 
     *   if the error isn't "unhandled exception," there's not a stored
     *   exception object; likewise, if there's no object parameter in the
     *   exception, there's nothing to use to obtain the message 
     */
    if (exc->get_error_code() != VMERR_UNHANDLED_EXC
        || exc->get_param_count() < 1)
        return 0;
    
    /* get the exception object */
    exc_obj = (vm_obj_id_t)exc->get_param_ulong(0);

    /* get the message from the object */
    return get_exc_message(vmg_ exc_obj, msg_len);
}